

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
LocalTriangleSphereCastCallback
          (LocalTriangleSphereCastCallback *this,btTransform *from,btTransform *to,
          btScalar ccdSphereRadius,btScalar hitFraction)

{
  btTransform *in_RDI;
  btScalar in_XMM0_Da;
  btScalar in_XMM1_Da;
  btTransform *in_stack_ffffffffffffffd0;
  
  btTriangleCallback::btTriangleCallback((btTriangleCallback *)in_RDI);
  *(undefined ***)(in_RDI->m_basis).m_el[0].m_floats =
       &PTR__LocalTriangleSphereCastCallback_002e3050;
  btTransform::btTransform(in_stack_ffffffffffffffd0,in_RDI);
  btTransform::btTransform(in_stack_ffffffffffffffd0,in_RDI);
  btTransform::btTransform(in_stack_ffffffffffffffd0);
  in_RDI[3].m_basis.m_el[0].m_floats[2] = in_XMM0_Da;
  in_RDI[3].m_basis.m_el[0].m_floats[3] = in_XMM1_Da;
  return;
}

Assistant:

LocalTriangleSphereCastCallback(const btTransform& from,const btTransform& to,btScalar ccdSphereRadius,btScalar hitFraction)
			:m_ccdSphereFromTrans(from),
			m_ccdSphereToTrans(to),
			m_ccdSphereRadius(ccdSphereRadius),
			m_hitFraction(hitFraction)
		{			
		}